

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_summary<2UL>::basic_dynamic_summary
          (basic_dynamic_summary<2UL> *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *quantiles,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name,milliseconds max_age)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  undefined1 uVar1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_RCX;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_RDX;
  string *in_RDI;
  string *in_R8;
  _Base_ptr in_R9;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  MetricType MVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>
  *this_00;
  _Base_ptr local_8;
  
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffb0;
  local_8 = in_R9;
  std::__cxx11::string::string(in_stack_ffffffffffffff10,__str);
  this_00 = (dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)__x02_>
             *)&stack0xffffffffffffff90;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__str);
  MVar2 = (MetricType)((ulong)__str >> 0x20);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  array(in_RDX,in_RCX);
  dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,6ul>,(unsigned_char)2>::
  metric_t<2ul>(this_00,MVar2,in_RDI,in_R8,in_RDX);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  std::__cxx11::string::~string(in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(in_stack_fffffffffffffed0);
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__basic_dynamic_summary_0032b648;
  __last._M_current = (double *)((long)&in_RDI[6].field_2 + 8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  in_RDI[7].field_2._M_allocated_capacity = (size_type)local_8;
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffec8);
  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffec8);
  __first._M_current._7_1_ = in_stack_fffffffffffffee7;
  __first._M_current._0_7_ = in_stack_fffffffffffffee0;
  uVar1 = std::
          is_sorted<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (__first,__last);
  if (!(bool)uVar1) {
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffec8);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffec8);
    __first_00._M_current._7_1_ = uVar1;
    __first_00._M_current._0_7_ = in_stack_fffffffffffffee0;
    std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (__first_00,__last);
  }
  return;
}

Assistant:

basic_dynamic_summary(
      std::string name, std::string help, std::vector<double> quantiles,
      std::array<std::string, N> labels_name,
      std::chrono::milliseconds max_age = std::chrono::seconds{60})
      : Base(MetricType::Summary, std::move(name), std::move(help),
             std::move(labels_name)),
        quantiles_(std::move(quantiles)),
        max_age_(max_age) {
    if (!std::is_sorted(quantiles_.begin(), quantiles_.end()))
      std::sort(quantiles_.begin(), quantiles_.end());
  }